

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

Vec_Int_t * Llb_Nonlin4CreateOrderSimple(Aig_Man_t *pAig)

{
  Vec_Int_t *p;
  void *pvVar1;
  int iVar2;
  int i;
  
  p = Vec_IntStartFull(pAig->vObjs->nSize);
  for (i = 0; i < pAig->vCis->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(pAig->vCis,i);
    Vec_IntWriteEntry(p,*(int *)((long)pvVar1 + 0x24),i);
  }
  for (iVar2 = 0; iVar2 < pAig->nRegs; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar2);
    Vec_IntWriteEntry(p,*(int *)((long)pvVar1 + 0x24),i + iVar2);
  }
  return p;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateOrderSimple( Aig_Man_t * pAig )
{
    Vec_Int_t * vOrder;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    vOrder = Vec_IntStartFull( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
    Saig_ManForEachLi( pAig, pObj, i )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
    return vOrder;
}